

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# builder.cpp
# Opt level: O0

void __thiscall mocker::ir::Builder::translateLogicBinary(Builder *this,BinaryExpr *node)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  BuilderContext *pBVar1;
  _List_node_base *p_Var2;
  _List_node_base *p_Var3;
  bool bVar4;
  undefined7 uVar5;
  __shared_count<(__gnu_cxx::_Lock_policy)2> val_00;
  LogicalExprInfo *pLVar6;
  FunctionModule *this_01;
  BBLIter val_01;
  NodeID id;
  element_type *peVar7;
  LogicalExprInfo infoBak;
  anon_class_16_2_53b759fd local_298;
  function<void_()> local_288;
  Defer local_268;
  shared_ptr<mocker::ir::IRInst> local_248;
  BBLIter local_238;
  undefined4 local_22c;
  shared_ptr<mocker::ir::IntLiteral> local_228;
  shared_ptr<mocker::ir::Reg> local_218;
  shared_ptr<mocker::ir::IRInst> local_208;
  BBLIter local_1f8;
  _List_node_base *local_1f0;
  shared_ptr<mocker::ir::IRInst> local_1e8;
  BBLIter local_1d8;
  undefined4 local_1cc;
  shared_ptr<mocker::ir::IntLiteral> local_1c8;
  shared_ptr<mocker::ir::Reg> local_1b8;
  shared_ptr<mocker::ir::IRInst> local_1a8;
  BBLIter local_198;
  _List_node_base *local_190;
  undefined1 local_188 [8];
  shared_ptr<mocker::ir::Jump> jumpSucc;
  shared_ptr<mocker::ir::Load> local_168;
  shared_ptr<mocker::ir::IRInst> local_158;
  BBLIter local_148;
  allocator<char> local_139;
  string local_138 [32];
  undefined1 local_118 [8];
  shared_ptr<mocker::ir::Reg> val;
  undefined1 local_100 [8];
  shared_ptr<mocker::ir::Label> succLabel;
  BBLIter succBB;
  shared_ptr<mocker::ir::IRInst> local_d8;
  BBLIter local_c8;
  allocator<char> local_b9;
  string local_b8 [32];
  undefined1 local_98 [8];
  shared_ptr<mocker::ir::Reg> boolExpAddr;
  Defer undo;
  LogicalExprInfo *info;
  BBLIter rhsFirstBB;
  BBLIter lhsFirstBB;
  FunctionModule *func;
  undefined1 local_30 [8];
  shared_ptr<mocker::ir::Label> originLabel;
  BBLIter originBB;
  BinaryExpr *node_local;
  Builder *this_local;
  
  pLVar6 = BuilderContext::getLogicalExprInfo(this->ctx);
  if ((pLVar6->inCondition & 1U) == 0) {
    translateEscapedLogicBinary(this,node);
  }
  else {
    originLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
         = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           BuilderContext::getCurBasicBlock(this->ctx);
    std::_List_const_iterator<mocker::ir::BasicBlock>::_List_const_iterator
              ((_List_const_iterator<mocker::ir::BasicBlock> *)&func,
               (iterator *)
               &originLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                _M_refcount);
    getBBLabel((Builder *)local_30,(const_iterator)this);
    this_01 = BuilderContext::getCurFunc(this->ctx);
    val_00 = originLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
             _M_refcount;
    val_01 = FunctionModule::pushBackBB(this_01);
    pLVar6 = BuilderContext::getLogicalExprInfo(this->ctx);
    Defer::Defer((Defer *)&boolExpAddr.
                           super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                           _M_refcount);
    if (((pLVar6->empty & 1U) != 0) && (pLVar6->empty = false, (pLVar6->inCondition & 1U) == 0)) {
      pBVar1 = this->ctx;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_b8,"boolExpAddr",&local_b9);
      BuilderContext::makeTempLocalReg((BuilderContext *)local_98,(string *)pBVar1);
      std::__cxx11::string::~string(local_b8);
      std::allocator<char>::~allocator(&local_b9);
      pBVar1 = this->ctx;
      local_c8 = FunctionModule::getFirstBB(this_01);
      std::make_shared<mocker::ir::Alloca,std::shared_ptr<mocker::ir::Reg>&>
                ((shared_ptr<mocker::ir::Reg> *)&succBB);
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Alloca,void>
                (&local_d8,(shared_ptr<mocker::ir::Alloca> *)&succBB);
      BuilderContext::appendInstFront(pBVar1,local_c8,&local_d8);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_d8);
      std::shared_ptr<mocker::ir::Alloca>::~shared_ptr((shared_ptr<mocker::ir::Alloca> *)&succBB);
      succLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)FunctionModule::pushBackBB(this_01);
      std::_List_const_iterator<mocker::ir::BasicBlock>::_List_const_iterator
                ((_List_const_iterator<mocker::ir::BasicBlock> *)
                 &val.super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>._M_refcount,
                 (iterator *)
                 &succLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      getBBLabel((Builder *)local_100,(const_iterator)this);
      pBVar1 = this->ctx;
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>(local_138,"v",&local_139);
      BuilderContext::makeTempLocalReg((BuilderContext *)local_118,(string *)pBVar1);
      std::__cxx11::string::~string(local_138);
      std::allocator<char>::~allocator(&local_139);
      pBVar1 = this->ctx;
      local_148._M_node =
           (_List_node_base *)
           succLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      std::
      make_shared<mocker::ir::Load,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::Reg>&>
                ((shared_ptr<mocker::ir::Reg> *)&local_168,(shared_ptr<mocker::ir::Reg> *)local_118)
      ;
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Load,void>(&local_158,&local_168);
      BuilderContext::appendInst(pBVar1,local_148,&local_158);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_158);
      std::shared_ptr<mocker::ir::Load>::~shared_ptr(&local_168);
      pBVar1 = this->ctx;
      id = ast::ASTNode::getID((ASTNode *)node);
      this_00 = &jumpSucc.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                 _M_refcount;
      std::shared_ptr<mocker::ir::Addr>::shared_ptr<mocker::ir::Reg,void>
                ((shared_ptr<mocker::ir::Addr> *)this_00,(shared_ptr<mocker::ir::Reg> *)local_118);
      BuilderContext::setExprAddr(pBVar1,id,(shared_ptr<mocker::ir::Addr> *)this_00);
      std::shared_ptr<mocker::ir::Addr>::~shared_ptr
                ((shared_ptr<mocker::ir::Addr> *)
                 &jumpSucc.super___shared_ptr<mocker::ir::Jump,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount);
      std::make_shared<mocker::ir::Jump,std::shared_ptr<mocker::ir::Label>&>
                ((shared_ptr<mocker::ir::Label> *)local_188);
      local_190 = (_List_node_base *)FunctionModule::pushBackBB(this_01);
      (pLVar6->trueNext)._M_node = local_190;
      pBVar1 = this->ctx;
      local_198._M_node = (pLVar6->trueNext)._M_node;
      local_1cc = 1;
      std::make_shared<mocker::ir::IntLiteral,int>((int *)&local_1c8);
      std::
      make_shared<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
                (&local_1b8,(shared_ptr<mocker::ir::IntLiteral> *)local_98);
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Store,void>
                (&local_1a8,(shared_ptr<mocker::ir::Store> *)&local_1b8);
      BuilderContext::appendInst(pBVar1,local_198,&local_1a8);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_1a8);
      std::shared_ptr<mocker::ir::Store>::~shared_ptr((shared_ptr<mocker::ir::Store> *)&local_1b8);
      std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_1c8);
      pBVar1 = this->ctx;
      local_1d8._M_node = (pLVar6->trueNext)._M_node;
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>
                (&local_1e8,(shared_ptr<mocker::ir::Jump> *)local_188);
      BuilderContext::appendInst(pBVar1,local_1d8,&local_1e8);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_1e8);
      local_1f0 = (_List_node_base *)FunctionModule::pushBackBB(this_01);
      (pLVar6->falseNext)._M_node = local_1f0;
      pBVar1 = this->ctx;
      local_1f8._M_node = (pLVar6->falseNext)._M_node;
      local_22c = 0;
      std::make_shared<mocker::ir::IntLiteral,int>((int *)&local_228);
      std::
      make_shared<mocker::ir::Store,std::shared_ptr<mocker::ir::Reg>&,std::shared_ptr<mocker::ir::IntLiteral>>
                (&local_218,(shared_ptr<mocker::ir::IntLiteral> *)local_98);
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Store,void>
                (&local_208,(shared_ptr<mocker::ir::Store> *)&local_218);
      BuilderContext::appendInst(pBVar1,local_1f8,&local_208);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_208);
      std::shared_ptr<mocker::ir::Store>::~shared_ptr((shared_ptr<mocker::ir::Store> *)&local_218);
      std::shared_ptr<mocker::ir::IntLiteral>::~shared_ptr(&local_228);
      pBVar1 = this->ctx;
      local_238._M_node = (pLVar6->falseNext)._M_node;
      std::shared_ptr<mocker::ir::IRInst>::shared_ptr<mocker::ir::Jump,void>
                (&local_248,(shared_ptr<mocker::ir::Jump> *)local_188);
      BuilderContext::appendInst(pBVar1,local_238,&local_248);
      std::shared_ptr<mocker::ir::IRInst>::~shared_ptr(&local_248);
      local_298.succBB._M_node =
           (_List_node_base *)
           succLabel.super___shared_ptr<mocker::ir::Label,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
           _M_pi;
      local_298.this = this;
      std::function<void()>::
      function<mocker::ir::Builder::translateLogicBinary(mocker::ast::BinaryExpr_const&)const::__0,void>
                ((function<void()> *)&local_288,&local_298);
      Defer::Defer(&local_268,&local_288);
      Defer::operator=((Defer *)&boolExpAddr.
                                 super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                                 _M_refcount,&local_268);
      Defer::~Defer(&local_268);
      std::function<void_()>::~function(&local_288);
      std::shared_ptr<mocker::ir::Jump>::~shared_ptr((shared_ptr<mocker::ir::Jump> *)local_188);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_118);
      std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_100);
      std::shared_ptr<mocker::ir::Reg>::~shared_ptr((shared_ptr<mocker::ir::Reg> *)local_98);
    }
    BuilderContext::setCurBasicBlock(this->ctx,(BBLIter)val_00._M_pi);
    bVar4 = pLVar6->empty;
    uVar5 = *(undefined7 *)&pLVar6->field_0x1;
    p_Var2 = (pLVar6->trueNext)._M_node;
    infoBak._1_7_ = SUB87((ulong)p_Var2 >> 8,0);
    p_Var3 = (pLVar6->falseNext)._M_node;
    infoBak.trueNext._M_node._0_1_ = SUB81(p_Var3,0);
    infoBak.trueNext._M_node._1_7_ = (undefined7)((ulong)p_Var3 >> 8);
    infoBak.falseNext._M_node._0_1_ = (undefined1)*(undefined8 *)&pLVar6->inCondition;
    if (node->op == LogicalOr) {
      (pLVar6->trueNext)._M_node = p_Var2;
      (pLVar6->falseNext)._M_node = val_01._M_node;
    }
    else if (node->op == LogicalAnd) {
      (pLVar6->trueNext)._M_node = val_01._M_node;
      (pLVar6->falseNext)._M_node = p_Var3;
    }
    peVar7 = std::
             __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&node->lhs);
    visit<mocker::ast::Expression>(this,peVar7);
    *(ulong *)((long)&(pLVar6->trueNext)._M_node + 1) =
         CONCAT17(infoBak.trueNext._M_node._0_1_,infoBak._1_7_);
    *(ulong *)((long)&(pLVar6->falseNext)._M_node + 1) =
         CONCAT17(infoBak.falseNext._M_node._0_1_,infoBak.trueNext._M_node._1_7_);
    pLVar6->empty = bVar4;
    *(undefined7 *)&pLVar6->field_0x1 = uVar5;
    (pLVar6->trueNext)._M_node = p_Var2;
    BuilderContext::setCurBasicBlock(this->ctx,val_01);
    peVar7 = std::
             __shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator*((__shared_ptr_access<mocker::ast::Expression,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)&node->rhs);
    visit<mocker::ast::Expression>(this,peVar7);
    Defer::~Defer((Defer *)&boolExpAddr.
                            super___shared_ptr<mocker::ir::Reg,_(__gnu_cxx::_Lock_policy)2>.
                            _M_refcount);
    std::shared_ptr<mocker::ir::Label>::~shared_ptr((shared_ptr<mocker::ir::Label> *)local_30);
  }
  return;
}

Assistant:

void Builder::translateLogicBinary(const ast::BinaryExpr &node) const {
  if (!ctx.getLogicalExprInfo().inCondition) {
    translateEscapedLogicBinary(node);
    return;
  }

  auto originBB = ctx.getCurBasicBlock();
  auto originLabel = getBBLabel(originBB);
  FunctionModule &func = ctx.getCurFunc();
  auto lhsFirstBB = originBB;
  auto rhsFirstBB = func.pushBackBB();
  auto &info = ctx.getLogicalExprInfo();

  Defer undo;
  while (info.empty) {
    info.empty = false;

    if (info.inCondition)
      break;

    auto boolExpAddr = ctx.makeTempLocalReg("boolExpAddr");
    ctx.appendInstFront(func.getFirstBB(),
                        std::make_shared<Alloca>(boolExpAddr));

    auto succBB = func.pushBackBB();
    auto succLabel = getBBLabel(succBB);
    auto val = ctx.makeTempLocalReg("v");
    ctx.appendInst(succBB, std::make_shared<Load>(val, boolExpAddr));
    ctx.setExprAddr(node.getID(), val);

    auto jumpSucc = std::make_shared<Jump>(succLabel);
    info.trueNext = func.pushBackBB();
    ctx.appendInst(
        info.trueNext,
        std::make_shared<Store>(boolExpAddr, std::make_shared<IntLiteral>(1)));
    ctx.appendInst(info.trueNext, jumpSucc);
    info.falseNext = func.pushBackBB();
    ctx.appendInst(
        info.falseNext,
        std::make_shared<Store>(boolExpAddr, std::make_shared<IntLiteral>(0)));
    ctx.appendInst(info.falseNext, jumpSucc);

    undo = Defer([this, succBB] {
      ctx.getLogicalExprInfo().empty = true;
      ctx.setCurBasicBlock(succBB);
    });

    break;
  }

  ctx.setCurBasicBlock(lhsFirstBB);
  auto infoBak = info;
  if (node.op == ast::BinaryExpr::LogicalOr) {
    info.trueNext = infoBak.trueNext;
    info.falseNext = rhsFirstBB;
  } else if (node.op == ast::BinaryExpr::LogicalAnd) {
    info.trueNext = rhsFirstBB;
    info.falseNext = infoBak.falseNext;
  }
  visit(*node.lhs);
  info = infoBak;

  ctx.setCurBasicBlock(rhsFirstBB);
  visit(*node.rhs);
}